

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_perform_apop(connectdata *conn)

{
  uchar *puVar1;
  uint uVar2;
  CURLcode CVar3;
  MD5_context *context;
  size_t sVar4;
  imapstate iVar5;
  long lVar6;
  char *buffer;
  uchar digest [16];
  char secret [33];
  byte local_68 [16];
  char local_58 [48];
  
  iVar5 = IMAP_STOP;
  if ((conn->bits).user_passwd == true) {
    context = Curl_MD5_init(Curl_DIGEST_MD5);
    if (context == (MD5_context *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = (uchar *)(conn->proto).imapc.mailbox_uidvalidity;
    sVar4 = strlen((char *)puVar1);
    uVar2 = curlx_uztoui(sVar4);
    Curl_MD5_update(context,puVar1,uVar2);
    puVar1 = (uchar *)conn->passwd;
    sVar4 = strlen((char *)puVar1);
    uVar2 = curlx_uztoui(sVar4);
    Curl_MD5_update(context,puVar1,uVar2);
    Curl_MD5_final(context,local_68);
    buffer = local_58;
    lVar6 = 0;
    do {
      curl_msnprintf(buffer,3,"%02x",(ulong)local_68[lVar6]);
      lVar6 = lVar6 + 1;
      buffer = buffer + 2;
    } while (lVar6 != 0x10);
    CVar3 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"APOP %s %s",conn->user,local_58);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    iVar5 = IMAP_LOGIN;
  }
  (conn->proto).imapc.state = iVar5;
  return CURLE_OK;
}

Assistant:

static CURLcode pop3_perform_apop(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  size_t i;
  MD5_context *ctxt;
  unsigned char digest[MD5_DIGEST_LEN];
  char secret[2 * MD5_DIGEST_LEN + 1];

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, POP3_STOP);

    return result;
  }

  /* Create the digest */
  ctxt = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!ctxt)
    return CURLE_OUT_OF_MEMORY;

  Curl_MD5_update(ctxt, (const unsigned char *) pop3c->apoptimestamp,
                  curlx_uztoui(strlen(pop3c->apoptimestamp)));

  Curl_MD5_update(ctxt, (const unsigned char *) conn->passwd,
                  curlx_uztoui(strlen(conn->passwd)));

  /* Finalise the digest */
  Curl_MD5_final(ctxt, digest);

  /* Convert the calculated 16 octet digest into a 32 byte hex string */
  for(i = 0; i < MD5_DIGEST_LEN; i++)
    snprintf(&secret[2 * i], 3, "%02x", digest[i]);

  result = Curl_pp_sendf(&pop3c->pp, "APOP %s %s", conn->user, secret);

  if(!result)
    state(conn, POP3_APOP);

  return result;
}